

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall pg::Game::parse_solution(Game *this,istream *in)

{
  ulong *puVar1;
  uint64_t *puVar2;
  bool bVar3;
  uint uVar4;
  istream *piVar5;
  long *plVar6;
  runtime_error *prVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int str;
  int w;
  string token;
  string line;
  stringstream ss;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&line);
    if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) != 0) {
      std::__cxx11::string::~string((string *)&line);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&line,_S_out|_S_in);
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    token._M_dataplus._M_p = (pointer)&token.field_2;
    piVar5 = std::operator>>((istream *)&ss,(string *)&token);
    if ((((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) == 0) &&
       (bVar3 = std::operator==(&token,"paritysol"), !bVar3)) {
      uVar4 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
      if (((int)uVar4 < 0) || (uVar9 = (ulong)uVar4, this->n_vertices <= (long)uVar9)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"node index out of bounds");
LAB_0013e196:
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = uVar4 >> 6;
      if (((this->solved)._bits[uVar4] >> (uVar9 & 0x3f) & 1) != 0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"node already solved");
        goto LAB_0013e196;
      }
      plVar6 = (long *)std::istream::operator>>((istream *)&ss,&w);
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"missing winner");
LAB_0013e166:
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (1 < (uint)w) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"invalid winner");
        goto LAB_0013e166;
      }
      uVar8 = 1L << (uVar9 & 0x3f);
      puVar1 = (this->solved)._bits + uVar4;
      *puVar1 = *puVar1 | uVar8;
      puVar2 = (this->winner)._bits;
      if (w == 0) {
        uVar10 = ~uVar8 & puVar2[uVar4];
      }
      else {
        uVar10 = puVar2[uVar4] | uVar8;
      }
      *(ulong *)((long)puVar2 + (ulong)(uVar4 << 3)) = uVar10;
      if (w == (uint)((*(ulong *)((long)(this->_owner)._bits + (ulong)(uVar4 << 3)) & uVar8) != 0))
      {
        plVar6 = (long *)std::istream::operator>>((istream *)&ss,&str);
        if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"missing strategy for winning node");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this->strategy[uVar9] = str;
      }
      else {
        this->strategy[uVar9] = -1;
      }
    }
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  } while( true );
}

Assistant:

void
Game::parse_solution(std::istream &in)
{
    string line;
    while (getline(in, line)) {
        stringstream ss(line);
        string token;

        // ignore empty line
        if (!(ss >> token)) continue;

        // ignore line with "paritysol"
        if (token == "paritysol") continue;

        // get node
        int ident = stoi(token);
        if (ident < 0 || ident >= n_vertices) {
            throw std::runtime_error("node index out of bounds");
        }

        if (solved[ident]) throw std::runtime_error("node already solved");

        // parse winner
        int w;
        if (!(ss >> w)) throw std::runtime_error("missing winner");
        if (w!= 0 && w!= 1) throw std::runtime_error("invalid winner");

        // set winner
        solved[ident] = true;
        winner[ident] = w;

        // parse strategy
        if (w == _owner[ident]) {
            int str;
            if (!(ss >> str)) throw std::runtime_error("missing strategy for winning node");
            // if (!has_edge(ident, str)) throw std::runtime_error("strategy not successor of node");
            // actually this is already checked by the verifier
            strategy[ident] = str;
        } else {
            strategy[ident] = -1;
        }
    }
}